

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::DiffuseAreaLight::DiffuseAreaLight
          (DiffuseAreaLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Le,Float scale,ShapeHandle *shape,Image *im,RGBColorSpace *imageColorSpace
          ,bool twoSided,Allocator alloc)

{
  bool bVar1;
  long lVar2;
  long in_FS_OFFSET;
  Float FVar3;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator<char> local_da;
  allocator<char> local_d9;
  int va;
  Float local_d4;
  Transform *local_d0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_c8;
  ImageChannelDesc desc;
  size_t vb;
  string local_70 [32];
  string local_50 [32];
  
  local_d4 = scale;
  local_d0 = renderFromLight;
  LightBase::LightBase(&this->super_LightBase,Area,renderFromLight,mediumInterface);
  local_c8.bits =
       (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->Lemit,(SpectrumHandle *)&local_c8,alloc);
  this->scale = local_d4;
  (this->shape).
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = 0;
  (this->shape).
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = (shape->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  this->twoSided = twoSided;
  FVar3 = TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
          ::Dispatch<pbrt::ShapeHandle::Area()const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                      *)shape);
  this->area = FVar3;
  this->imageColorSpace = imageColorSpace;
  Image::Image(&this->image,im);
  *(long *)(in_FS_OFFSET + -0x398) = *(long *)(in_FS_OFFSET + -0x398) + 1;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    if (((Le->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
         ).bits & 0xffffffffffff) == 0) {
      LogFatal<char_const(&)[3]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x268,"Check failed: %s",(char (*) [3])"Le");
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&vb,"R",(allocator<char> *)&va);
    std::__cxx11::string::string<std::allocator<char>>(local_70,"G",&local_d9);
    std::__cxx11::string::string<std::allocator<char>>(local_50,"B",&local_da);
    requestedChannels.n = 3;
    requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
    ;
    Image::GetChannelDesc(&desc,&this->image,requestedChannels);
    lVar2 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&vb + lVar2));
      lVar2 = lVar2 + -0x20;
    } while (lVar2 != -0x20);
    if (desc.offset.nStored == 0) {
      ErrorExit<>("Image used for DiffuseAreaLight doesn\'t have R, G, B channels.");
    }
    va = 3;
    vb = desc.offset.nStored;
    if (desc.offset.nStored != 3) {
      LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x264,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x49401b,
                 (char (*) [12])"desc.size()",(char (*) [2])0x49401b,&va,
                 (char (*) [12])"desc.size()",(unsigned_long *)&vb);
    }
    bVar1 = ImageChannelDesc::IsIdentity(&desc);
    if (!bVar1) {
      LogFatal<char_const(&)[18]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x265,"Check failed: %s",(char (*) [18])"desc.IsIdentity()");
    }
    if (imageColorSpace == (RGBColorSpace *)0x0) {
      LogFatal<char_const(&)[27]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x266,"Check failed: %s",(char (*) [27])"imageColorSpace != nullptr");
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc.offset);
  }
  bVar1 = Transform::HasScale(local_d0,0.001);
  if ((bVar1) &&
     ((ushort)((ushort)((shape->
                        super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                        ).bits >> 0x30) | 1) != 5)) {
    Warning<>(
             "Scaling detected in world to light transformation! The system has numerous assumptions, implicit and explicit, that this transform will have no scale factors in it. Proceed at your own risk; your image may have errors."
             );
  }
  return;
}

Assistant:

DiffuseAreaLight::DiffuseAreaLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle Le, Float scale,
                                   const ShapeHandle shape, Image im,
                                   const RGBColorSpace *imageColorSpace, bool twoSided,
                                   Allocator alloc)
    : LightBase(LightType::Area, renderFromLight, mediumInterface),
      Lemit(Le, alloc),
      scale(scale),
      shape(shape),
      twoSided(twoSided),
      area(shape.Area()),
      imageColorSpace(imageColorSpace),
      image(std::move(im)) {
    ++numAreaLights;

    if (image) {
        ImageChannelDesc desc = image.GetChannelDesc({"R", "G", "B"});
        if (!desc)
            ErrorExit("Image used for DiffuseAreaLight doesn't have R, G, B "
                      "channels.");
        CHECK_EQ(3, desc.size());
        CHECK(desc.IsIdentity());
        CHECK(imageColorSpace != nullptr);
    } else {
        CHECK(Le);
    }

    // Warn if light has transformation with non-uniform scale, though not
    // for Triangles, since this doesn't matter for them.
    // FIXME: is this still true with animated transformations?
    if (renderFromLight.HasScale() && !shape.Is<Triangle>() && !shape.Is<BilinearPatch>())
        Warning("Scaling detected in world to light transformation! "
                "The system has numerous assumptions, implicit and explicit, "
                "that this transform will have no scale factors in it. "
                "Proceed at your own risk; your image may have errors.");
}